

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::CreateScriptContext_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  TTDCreateJsRTContextCallback p_Var1;
  TTD_LOG_PTR_ID origId;
  void *pvVar2;
  ScriptContext *local_30;
  ScriptContext *resCtx;
  
  if (evt->EventKind != CreateScriptContextActionTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  local_30 = (ScriptContext *)0x0;
  p_Var1 = (executeContext->TTDExternalObjectFunctions).pfCreateJsRTContextCallback;
  pvVar2 = ThreadContextTTD::GetRuntimeHandle(executeContext);
  (*p_Var1)(pvVar2,&local_30);
  if (local_30 != (ScriptContext *)0x0) {
    origId._0_4_ = evt[1].EventKind;
    origId._4_4_ = evt[1].ResultStatus;
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,origId,
               (RecyclableObject *)(local_30->super_ScriptContextBase).globalObject);
    local_30->ScriptContextLogTag = *(TTD_LOG_PTR_ID *)(evt + 1);
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,*(TTD_LOG_PTR_ID *)evt[1].EventTimeStamp,
               (((local_30->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
               ).undefinedValue.ptr);
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,*(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 8),
               (((local_30->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
               ).nullValue.ptr);
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,*(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 0x10),
               &((((local_30->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).booleanTrue.ptr)->super_RecyclableObject);
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,*(TTD_LOG_PTR_ID *)(evt[1].EventTimeStamp + 0x18),
               &((((local_30->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).booleanFalse.ptr)->super_RecyclableObject);
    return;
  }
  TTDAbort_unrecoverable_error("Create failed");
}

Assistant:

void CreateScriptContext_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTCreateScriptContextAction* cAction = GetInlineEventDataAs<JsRTCreateScriptContextAction, EventKind::CreateScriptContextActionTag>(evt);

            Js::ScriptContext* resCtx = nullptr;
            executeContext->TTDExternalObjectFunctions.pfCreateJsRTContextCallback(executeContext->GetRuntimeHandle(), &resCtx);
            TTDAssert(resCtx != nullptr, "Create failed");

            executeContext->AddRootRef_Replay(cAction->GlobalObject, resCtx->GetGlobalObject());
            resCtx->ScriptContextLogTag = cAction->GlobalObject;

            executeContext->AddRootRef_Replay(cAction->KnownObjects->UndefinedObject, resCtx->GetLibrary()->GetUndefined());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->NullObject, resCtx->GetLibrary()->GetNull());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->TrueObject, resCtx->GetLibrary()->GetTrue());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->FalseObject, resCtx->GetLibrary()->GetFalse());
        }